

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-type.c
# Opt level: O0

coda_netcdf_basic_type *
coda_netcdf_basic_type_new(int nc_type,int64_t offset,int record_var,int64_t length)

{
  int iVar1;
  coda_type_text *pcVar2;
  coda_type_number *pcVar3;
  int64_t local_48;
  int64_t byte_size;
  coda_native_type read_type;
  coda_netcdf_basic_type *type;
  int64_t length_local;
  int record_var_local;
  int64_t offset_local;
  coda_netcdf_basic_type *pcStack_10;
  int nc_type_local;
  
  pcStack_10 = (coda_netcdf_basic_type *)malloc(0x28);
  if (pcStack_10 == (coda_netcdf_basic_type *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-type.c"
                   ,0x7c);
    pcStack_10 = (coda_netcdf_basic_type *)0x0;
  }
  else {
    pcStack_10->backend = coda_backend_netcdf;
    pcStack_10->definition = (coda_type *)0x0;
    pcStack_10->attributes = (coda_mem_record *)0x0;
    pcStack_10->offset = offset;
    pcStack_10->record_var = record_var;
    switch(nc_type) {
    case 1:
      byte_size._4_4_ = coda_native_type_int8;
      local_48 = 1;
      pcVar3 = coda_type_number_new(coda_format_netcdf,coda_integer_class);
      pcStack_10->definition = (coda_type *)pcVar3;
      break;
    case 2:
      byte_size._4_4_ = coda_native_type_char;
      if (1 < length) {
        byte_size._4_4_ = coda_native_type_string;
      }
      pcVar2 = coda_type_text_new(coda_format_netcdf);
      pcStack_10->definition = (coda_type *)pcVar2;
      local_48 = length;
      break;
    case 3:
      byte_size._4_4_ = coda_native_type_int16;
      local_48 = 2;
      pcVar3 = coda_type_number_new(coda_format_netcdf,coda_integer_class);
      pcStack_10->definition = (coda_type *)pcVar3;
      break;
    case 4:
      byte_size._4_4_ = coda_native_type_int32;
      local_48 = 4;
      pcVar3 = coda_type_number_new(coda_format_netcdf,coda_integer_class);
      pcStack_10->definition = (coda_type *)pcVar3;
      break;
    case 5:
      byte_size._4_4_ = coda_native_type_float;
      local_48 = 4;
      pcVar3 = coda_type_number_new(coda_format_netcdf,coda_real_class);
      pcStack_10->definition = (coda_type *)pcVar3;
      break;
    case 6:
      byte_size._4_4_ = coda_native_type_double;
      local_48 = 8;
      pcVar3 = coda_type_number_new(coda_format_netcdf,coda_real_class);
      pcStack_10->definition = (coda_type *)pcVar3;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-type.c"
                    ,0xa6,
                    "coda_netcdf_basic_type *coda_netcdf_basic_type_new(int, int64_t, int, int64_t)"
                   );
    }
    if (pcStack_10->definition == (coda_type *)0x0) {
      coda_dynamic_type_delete((coda_dynamic_type *)pcStack_10);
      pcStack_10 = (coda_netcdf_basic_type *)0x0;
    }
    else {
      iVar1 = coda_type_set_read_type(pcStack_10->definition,byte_size._4_4_);
      if (iVar1 == 0) {
        iVar1 = coda_type_set_byte_size(pcStack_10->definition,local_48);
        if (iVar1 != 0) {
          coda_dynamic_type_delete((coda_dynamic_type *)pcStack_10);
          pcStack_10 = (coda_netcdf_basic_type *)0x0;
        }
      }
      else {
        coda_dynamic_type_delete((coda_dynamic_type *)pcStack_10);
        pcStack_10 = (coda_netcdf_basic_type *)0x0;
      }
    }
  }
  return pcStack_10;
}

Assistant:

coda_netcdf_basic_type *coda_netcdf_basic_type_new(int nc_type, int64_t offset, int record_var, int64_t length)
{
    coda_netcdf_basic_type *type;
    coda_native_type read_type;
    int64_t byte_size;

    type = malloc(sizeof(coda_netcdf_basic_type));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_netcdf_basic_type), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_netcdf;
    type->definition = NULL;
    type->attributes = NULL;
    type->offset = offset;
    type->record_var = record_var;

    switch (nc_type)
    {
        case 1:
            read_type = coda_native_type_int8;
            byte_size = 1;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_integer_class);
            break;
        case 2:
            read_type = (length > 1) ? coda_native_type_string : coda_native_type_char;
            byte_size = length;
            type->definition = (coda_type *)coda_type_text_new(coda_format_netcdf);
            break;
        case 3:
            read_type = coda_native_type_int16;
            byte_size = 2;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_integer_class);
            break;
        case 4:
            read_type = coda_native_type_int32;
            byte_size = 4;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_integer_class);
            break;
        case 5:
            read_type = coda_native_type_float;
            byte_size = 4;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_real_class);
            break;
        case 6:
            read_type = coda_native_type_double;
            byte_size = 8;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_real_class);
            break;
        default:
            assert(0);
            exit(1);
    }
    if (type->definition == NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    if (coda_type_set_read_type(type->definition, read_type) != 0)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    if (coda_type_set_byte_size(type->definition, byte_size) != 0)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        return NULL;
    }

    return type;
}